

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t code;
  XXH64_hash_t XVar4;
  undefined4 *puVar5;
  ulong uVar6;
  ulong uVar7;
  size_t code_00;
  ulong uVar8;
  size_t sVar9;
  undefined4 *puVar10;
  
  code = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  uVar3 = ZSTD_isError(code);
  if (uVar3 != 0) {
    return code;
  }
  if (cctx->stage == ZSTDcs_created) {
    code_00 = 0xffffffffffffffc4;
  }
  else {
    puVar10 = (undefined4 *)((long)dst + code);
    uVar7 = dstCapacity - code;
    puVar5 = puVar10;
    if (cctx->stage == ZSTDcs_init) {
      uVar3 = (cctx->appliedParams).fParams.contentSizeFlag;
      uVar1 = (cctx->appliedParams).fParams.checksumFlag;
      code_00 = 0xffffffffffffffba;
      if (0x11 < uVar7) {
        uVar2 = (cctx->appliedParams).cParams.windowLog;
        if ((cctx->appliedParams).format == ZSTD_f_zstd1) {
          *puVar10 = 0xfd2fb528;
          uVar6 = 4;
        }
        else {
          uVar6 = 0;
        }
        uVar8 = uVar6 | 1;
        *(char *)((long)puVar10 + uVar6) = (uVar3 != 0) << 5 | (uVar1 != 0) << 2;
        if (uVar3 == 0) {
          code_00 = uVar6 | 2;
          *(char *)((long)puVar10 + uVar8) = (char)uVar2 * '\b' + -0x50;
        }
        else {
          *(undefined1 *)((long)puVar10 + uVar8) = 0;
          code_00 = uVar8 + 1;
        }
      }
      uVar3 = ZSTD_isError(code_00);
      if (uVar3 != 0) goto LAB_001586d6;
      uVar7 = uVar7 - code_00;
      cctx->stage = ZSTDcs_ongoing;
      puVar5 = (undefined4 *)(code_00 + (long)puVar10);
    }
    uVar6 = uVar7;
    if (cctx->stage != ZSTDcs_ending) {
      if (3 < uVar7) {
        *puVar5 = 1;
        puVar5 = (undefined4 *)((long)puVar5 + 3);
        uVar6 = uVar7 - 3;
      }
      code_00 = 0xffffffffffffffba;
      if (uVar7 < 4) goto LAB_001586d6;
    }
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      XVar4 = XXH64_digest(&cctx->xxhState);
      if (3 < uVar6) {
        *puVar5 = (int)XVar4;
        puVar5 = puVar5 + 1;
      }
      code_00 = 0xffffffffffffffba;
      if (uVar6 < 4) goto LAB_001586d6;
    }
    cctx->stage = ZSTDcs_created;
    code_00 = (long)puVar5 - (long)puVar10;
  }
LAB_001586d6:
  uVar3 = ZSTD_isError(code_00);
  sVar9 = code_00;
  if ((uVar3 == 0) &&
     ((cctx->pledgedSrcSizePlusOne == 0 ||
      (sVar9 = 0xffffffffffffffb8, cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1)))) {
    sVar9 = code_00 + code;
  }
  return sVar9;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    if (ZSTD_isError(cSize)) return cSize;
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    if (ZSTD_isError(endResult)) return endResult;
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        if (cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1) {
            DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize = %u",
                (U32)cctx->pledgedSrcSizePlusOne-1, (U32)cctx->consumedSrcSize);
            return ERROR(srcSize_wrong);
    }   }
    return cSize + endResult;
}